

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc_tag.cpp
# Opt level: O3

int32_t ulocimp_forLanguageTag_63
                  (char *langtag,int32_t tagLen,char *localeID,int32_t localeIDCapacity,
                  int32_t *parsedLength,UErrorCode *status)

{
  AttributeListEntry *pAVar1;
  char cVar2;
  char cVar3;
  UBool UVar4;
  int32_t iVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  ULanguageTag *langtag_00;
  size_t __n;
  char *pcVar9;
  VariantListEntry *pVVar10;
  undefined4 extraout_var;
  undefined8 uVar11;
  char **ppcVar12;
  char *pcVar13;
  ExtensionListEntry *pEVar14;
  AttributeListEntry *pAVar15;
  char *pcVar16;
  int iVar17;
  int iVar18;
  ExtensionListEntry *pEVar19;
  ulong uVar20;
  long lVar21;
  VariantListEntry **ppVVar22;
  int iVar23;
  int32_t length;
  VariantListEntry **s;
  int iVar24;
  UErrorCode UVar25;
  char *pcVar26;
  uint uVar27;
  ulong uVar28;
  ExtensionListEntry **ppEVar29;
  ulong uVar30;
  int iVar31;
  AttributeListEntry *pAVar32;
  bool bVar33;
  UBool firstValue;
  AttributeListEntry *attrFirst;
  ExtensionListEntry *kwdFirst;
  char bcpKeyBuf [9];
  char attrBuf [100];
  ExtensionListEntry *local_1d0;
  char local_1c8;
  short local_1b8;
  char *local_1b0;
  char *local_1a8;
  ulong local_1a0;
  VariantListEntry **local_190;
  ExtensionListEntry *local_180;
  char **local_178;
  char *local_170;
  UErrorCode *local_168;
  VariantListEntry **local_160;
  ulong local_158;
  ulong local_150;
  VariantListEntry **local_148;
  AttributeListEntry *local_140;
  ExtensionListEntry *local_138;
  char local_129 [9];
  size_t local_120;
  char local_118 [128];
  char acStack_98 [104];
  
  if (parsedLength != (int32_t *)0x0) {
    *parsedLength = 0;
  }
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  local_1a0._0_4_ = tagLen;
  if (tagLen < 0) {
    sVar7 = strlen(langtag);
    local_1a0._0_4_ = (int32_t)sVar7;
  }
  pcVar8 = (char *)uprv_malloc_63((long)(int)((int32_t)local_1a0 + 1U));
  if (pcVar8 == (char *)0x0) {
LAB_002b40e5:
    *status = U_MEMORY_ALLOCATION_ERROR;
    return 0;
  }
  memcpy(pcVar8,langtag,(long)(int32_t)local_1a0);
  pcVar8[(int32_t)local_1a0] = '\0';
  langtag_00 = (ULanguageTag *)uprv_malloc_63(0x58);
  if (langtag_00 == (ULanguageTag *)0x0) {
    uprv_free_63(pcVar8);
    goto LAB_002b40e5;
  }
  langtag_00->language = "";
  langtag_00->extlang[0] = (char *)0x0;
  langtag_00->extlang[1] = (char *)0x0;
  langtag_00->extlang[2] = (char *)0x0;
  langtag_00->script = "";
  langtag_00->region = "";
  langtag_00->variants = (VariantListEntry *)0x0;
  langtag_00->extensions = (ExtensionListEntry *)0x0;
  langtag_00->grandfathered = "";
  langtag_00->privateuse = "";
  langtag_00->buf = pcVar8;
  local_168 = status;
  if ((int32_t)local_1a0 < 2) goto LAB_002b4837;
  local_178 = langtag_00->extlang;
  local_160 = &langtag_00->variants;
  uVar28 = 0xfffffffffffffffe;
  do {
    iVar17 = uprv_stricmp_63(GRANDFATHERED[uVar28 + 2],pcVar8);
    if (iVar17 == 0) {
      pcVar13 = GRANDFATHERED[uVar28 + 3];
      sVar7 = strlen(pcVar13);
      if ((int32_t)local_1a0 < (int)sVar7) {
        uprv_free_63(pcVar8);
        pcVar26 = (char *)uprv_malloc_63((ulong)((int)sVar7 + 1));
        if (pcVar26 == (char *)0x0) goto LAB_002b4728;
        langtag_00->buf = pcVar26;
        pcVar8 = pcVar26;
      }
      else {
        pcVar26 = langtag_00->buf;
      }
      strcpy(pcVar26,pcVar13);
      local_170 = (char *)0x0;
      goto LAB_002b4251;
    }
    uVar28 = uVar28 + 2;
  } while (uVar28 < 0x32);
  uVar28 = 0xfffffffffffffffe;
  do {
    pcVar13 = REDUNDANT[uVar28 + 2];
    sVar7 = strlen(pcVar13);
    iVar17 = uprv_strnicmp_63(pcVar13,pcVar8,(uint32_t)sVar7);
    if ((iVar17 == 0) && ((pcVar8[sVar7] == '-' || (pcVar8[sVar7] == '\0')))) {
      pcVar13 = REDUNDANT[uVar28 + 3];
      __n = strlen(pcVar13);
      strncpy(langtag_00->buf,pcVar13,__n);
      if (pcVar8[sVar7] == '-') {
        memmove(pcVar8 + __n,pcVar8 + sVar7,((int32_t)local_1a0 + 1U) - sVar7);
      }
      else {
        pcVar8[__n] = '\0';
      }
      local_170 = (char *)(sVar7 - __n);
      local_1a0._0_4_ = 0;
      goto LAB_002b4251;
    }
    uVar28 = uVar28 + 2;
  } while (uVar28 < 0x32);
  local_1a0._0_4_ = 0;
  local_170 = (char *)0x0;
LAB_002b4251:
  ppEVar29 = &langtag_00->extensions;
  local_150 = 0;
  uVar27 = 0x81;
  local_148 = (VariantListEntry **)0x0;
  local_1b0 = (char *)0x0;
  local_1a8 = (char *)0x0;
  local_1d0 = (ExtensionListEntry *)0x0;
  pcVar13 = pcVar8;
  do {
    iVar17 = 0;
    for (pcVar26 = pcVar13; (cVar3 = *pcVar26, cVar3 != '\0' && (cVar3 != '-'));
        pcVar26 = pcVar26 + 1) {
      iVar17 = iVar17 + 1;
    }
    pcVar16 = (char *)0x0;
    if (cVar3 != '\0') {
      pcVar16 = pcVar26 + 1;
    }
    local_1b8 = (short)uVar27;
    pcVar9 = pcVar26;
    if (((uVar27 & 1) == 0) || (UVar4 = _isLanguageSubtag(pcVar13,iVar17), UVar4 == '\0')) {
      if ((uVar27 & 2) != 0) {
        iVar23 = iVar17;
        if (iVar17 < 0) {
          sVar7 = strlen(pcVar13);
          iVar23 = (int)sVar7;
        }
        if (iVar23 == 3) {
          lVar21 = 0;
          do {
            UVar4 = uprv_isASCIILetter_63(pcVar13[lVar21]);
            if (UVar4 == '\0') goto LAB_002b438c;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 3);
          *pcVar26 = '\0';
          pcVar8 = T_CString_toLowerCase_63(pcVar13);
          iVar17 = (int)local_150;
          local_150 = (ulong)(iVar17 + 1);
          local_178[iVar17] = pcVar8;
          uVar27 = (uint)(iVar17 < 2) * 2 + 0xbc;
          goto LAB_002b470f;
        }
      }
LAB_002b438c:
      if (((uVar27 & 4) == 0) || (UVar4 = _isScriptSubtag(pcVar13,iVar17), UVar4 == '\0')) {
        if (((uVar27 & 8) == 0) || (UVar4 = _isRegionSubtag(pcVar13,iVar17), UVar4 == '\0')) {
          if ((uVar27 & 0x10) != 0) {
            UVar4 = _isVariantSubtag(pcVar13,iVar17);
            if (UVar4 != '\0') {
LAB_002b44bc:
              pVVar10 = (VariantListEntry *)uprv_malloc_63(0x10);
              status = local_168;
              if (pVVar10 == (VariantListEntry *)0x0) goto LAB_002b4728;
              *pcVar26 = '\0';
              pcVar13 = T_CString_toUpperCase_63(pcVar13);
              pVVar10->variant = pcVar13;
              UVar4 = _addVariantToList(local_160,pVVar10);
              uVar27 = 0xb0;
              if (UVar4 != '\0') goto LAB_002b470f;
              uprv_free_63(pVVar10);
              break;
            }
            if ((char)local_148 != '\0') {
              iVar23 = iVar17;
              if (iVar17 < 0) {
                sVar7 = strlen(pcVar13);
                iVar23 = (int)sVar7;
              }
              if ((iVar23 - 1U < 8) &&
                 (UVar4 = _isAlphaNumericString(pcVar13,iVar23), UVar4 != '\0')) goto LAB_002b44bc;
            }
          }
          pcVar9 = pcVar8;
          if (((uVar27 & 0x20) == 0) ||
             (UVar4 = _isExtensionSingleton(pcVar13,iVar17), UVar4 == '\0')) {
            if (((uVar27 & 0x40) == 0) ||
               (UVar4 = _isExtensionSubtag(pcVar13,iVar17), UVar4 == '\0')) {
              local_1c8 = (char)uVar27;
              if (((-1 < local_1c8) || (cVar2 = uprv_asciitolower_63(*pcVar13), iVar17 != 1)) ||
                 (cVar2 != 'x')) break;
              if (local_1d0 != (ExtensionListEntry *)0x0) {
                if ((local_1a8 != (char *)0x0) && (local_1b0 != (char *)0x0)) {
                  *local_1b0 = '\0';
                  pcVar8 = T_CString_toLowerCase_63(local_1a8);
                  local_1d0->value = pcVar8;
                  UVar4 = _addExtensionToList(ppEVar29,local_1d0,'\0');
                  pcVar8 = local_1b0;
                  if (UVar4 != '\0') goto LAB_002b4614;
                }
                uprv_free_63(local_1d0);
                goto LAB_002b4802;
              }
LAB_002b4614:
              pcVar9 = pcVar8;
              pcVar13 = pcVar26 + 1;
              if (cVar3 == '\0') goto LAB_002b4802;
              do {
                pcVar9 = pcVar8;
                if (pcVar13 == (char *)0x0) {
                  pcVar26 = (char *)0x0;
                  break;
                }
                iVar17 = 0;
                for (pcVar8 = pcVar13; (cVar3 = *pcVar8, cVar3 != '\0' && (cVar3 != '-'));
                    pcVar8 = pcVar8 + 1) {
                  iVar17 = iVar17 + 1;
                }
                pcVar26 = (char *)0x0;
                if (cVar3 != '\0') {
                  pcVar26 = pcVar8 + 1;
                }
                iVar23 = strncmp(pcVar13,"lvariant",8);
                if (iVar23 == 0) {
                  *pcVar8 = '\0';
                  uVar11 = CONCAT62((int6)(CONCAT44(extraout_var,iVar23) >> 0x10),0x10);
                  uVar27 = (uint)uVar11;
                  local_148 = (VariantListEntry **)CONCAT71((int7)((ulong)uVar11 >> 8),1);
                  pcVar16 = pcVar26;
                  goto LAB_002b46a9;
                }
                UVar4 = _isPrivateuseValueSubtag(pcVar13,iVar17);
                pcVar13 = pcVar26;
              } while (UVar4 != '\0');
              if (local_1b8 != 0x10) {
                if (pcVar9 != pcVar16 && -1 < (long)pcVar9 - (long)pcVar16) {
                  *pcVar9 = '\0';
                  pcVar8 = T_CString_toLowerCase_63(pcVar16);
                  langtag_00->privateuse = pcVar8;
                }
                goto LAB_002b4802;
              }
              uVar27 = 0x10;
              pcVar16 = pcVar26;
LAB_002b46a9:
              local_1d0 = (ExtensionListEntry *)0x0;
            }
            else {
              if (local_1a8 == (char *)0x0) {
                local_1a8 = pcVar13;
              }
              uVar27 = 0xe0;
              local_1b0 = pcVar26;
            }
          }
          else {
            if (local_1d0 != (ExtensionListEntry *)0x0) {
              if ((local_1a8 != (char *)0x0) && (local_1b0 != (char *)0x0)) {
                *local_1b0 = '\0';
                pcVar9 = T_CString_toLowerCase_63(local_1a8);
                local_1d0->value = pcVar9;
                UVar4 = _addExtensionToList(ppEVar29,local_1d0,'\0');
                pcVar9 = local_1b0;
                if (UVar4 != '\0') goto LAB_002b46bc;
              }
              uprv_free_63(local_1d0);
              pcVar9 = pcVar8;
              goto LAB_002b4802;
            }
LAB_002b46bc:
            local_1d0 = (ExtensionListEntry *)uprv_malloc_63(0x18);
            status = local_168;
            if (local_1d0 == (ExtensionListEntry *)0x0) goto LAB_002b4728;
            *pcVar26 = '\0';
            pcVar8 = T_CString_toLowerCase_63(pcVar13);
            local_1d0->key = pcVar8;
            local_1d0->value = (char *)0x0;
            uVar27 = 0x40;
            local_1a8 = (char *)0x0;
            local_1b0 = (char *)0x0;
          }
        }
        else {
          *pcVar26 = '\0';
          pcVar8 = T_CString_toUpperCase_63(pcVar13);
          langtag_00->region = pcVar8;
          uVar27 = 0xb0;
        }
      }
      else {
        *pcVar26 = '\0';
        cVar3 = uprv_toupper_63(*pcVar13);
        *pcVar13 = cVar3;
        cVar3 = pcVar13[1];
        if (cVar3 != '\0') {
          pcVar8 = pcVar13 + 2;
          do {
            cVar3 = uprv_asciitolower_63(cVar3);
            pcVar8[-1] = cVar3;
            cVar3 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar3 != '\0');
        }
        langtag_00->script = pcVar13;
        uVar27 = 0xb8;
      }
    }
    else {
      *pcVar26 = '\0';
      pcVar8 = T_CString_toLowerCase_63(pcVar13);
      langtag_00->language = pcVar8;
      uVar27 = (uint)(iVar17 < 4) * 2 + 0xbc;
    }
LAB_002b470f:
    pcVar8 = pcVar9;
    pcVar13 = pcVar16;
  } while (pcVar16 != (char *)0x0);
  pcVar9 = pcVar8;
  if (local_1d0 != (ExtensionListEntry *)0x0) {
    if ((local_1a8 != (char *)0x0) && (local_1b0 != (char *)0x0)) {
      *local_1b0 = '\0';
      pcVar13 = T_CString_toLowerCase_63(local_1a8);
      local_1d0->value = pcVar13;
      UVar4 = _addExtensionToList(ppEVar29,local_1d0,'\0');
      pcVar9 = local_1b0;
      if (UVar4 != '\0') goto LAB_002b4802;
    }
    uprv_free_63(local_1d0);
    pcVar9 = pcVar8;
  }
LAB_002b4802:
  status = local_168;
  if (parsedLength != (int32_t *)0x0) {
    if ((int32_t)local_1a0 < 1) {
      local_1a0._0_4_ = ((int)local_170 + (int)pcVar9) - *(int *)&langtag_00->buf;
    }
    *parsedLength = (int32_t)local_1a0;
  }
LAB_002b4837:
  if (U_ZERO_ERROR < *status) {
    return 0;
  }
  iVar17 = 0;
  lVar21 = 2;
  do {
    iVar17 = (iVar17 + 1) - (uint)(langtag_00->extlang[lVar21 + -2] == (char *)0x0);
    lVar21 = lVar21 + 1;
  } while (lVar21 != 5);
  ppcVar12 = langtag_00->extlang;
  if (iVar17 == 0) {
    ppcVar12 = &langtag_00->language;
  }
  pcVar8 = *ppcVar12;
  iVar17 = strcmp(pcVar8,"und");
  uVar28 = 0;
  if (iVar17 != 0) {
    sVar7 = strlen(pcVar8);
    if (0 < (int)sVar7) {
      if (0 < localeIDCapacity) {
        iVar5 = uprv_min_63((int)sVar7,localeIDCapacity);
        memcpy(localeID,pcVar8,(long)iVar5);
      }
      uVar28 = sVar7 & 0xffffffff;
    }
  }
  pcVar8 = langtag_00->script;
  sVar7 = strlen(pcVar8);
  if (0 < (int)sVar7) {
    if ((int)uVar28 < localeIDCapacity) {
      localeID[uVar28] = '_';
    }
    uVar27 = (int)uVar28 + 1;
    cVar3 = *pcVar8;
    if (cVar3 != '\0') {
      lVar21 = 0;
      do {
        if ((int)(uVar27 + (int)lVar21) < localeIDCapacity) {
          if (lVar21 == 0) {
            cVar3 = uprv_toupper_63(cVar3);
          }
          localeID[lVar21 + (ulong)uVar27] = cVar3;
        }
        cVar3 = pcVar8[lVar21 + 1];
        lVar21 = lVar21 + 1;
      } while (cVar3 != '\0');
      uVar27 = uVar27 + (int)lVar21;
    }
    uVar28 = (ulong)uVar27;
  }
  pcVar8 = langtag_00->region;
  sVar7 = strlen(pcVar8);
  if (0 < (int)sVar7) {
    if ((int)uVar28 < localeIDCapacity) {
      localeID[uVar28] = '_';
    }
    uVar27 = (int)uVar28 + 1;
    uVar28 = (ulong)uVar27;
    cVar3 = *pcVar8;
    if (cVar3 != '\0') {
      lVar21 = 0;
      do {
        if ((int)(uVar27 + (int)lVar21) < localeIDCapacity) {
          cVar3 = uprv_toupper_63(cVar3);
          localeID[lVar21 + (ulong)uVar27] = cVar3;
        }
        cVar3 = pcVar8[lVar21 + 1];
        lVar21 = lVar21 + 1;
      } while (cVar3 != '\0');
      uVar28 = (ulong)(uVar27 + (int)lVar21);
    }
  }
  pVVar10 = langtag_00->variants;
  if (pVVar10 != (VariantListEntry *)0x0) {
    iVar17 = 0;
    do {
      pVVar10 = pVVar10->next;
      iVar17 = iVar17 + 1;
    } while (pVVar10 != (VariantListEntry *)0x0);
    if ((int)sVar7 < 1) {
      if ((int)uVar28 < localeIDCapacity) {
        localeID[uVar28] = '_';
      }
      uVar28 = (ulong)((int)uVar28 + 1);
    }
    iVar23 = 0;
    iVar31 = 1;
    do {
      iVar18 = iVar31;
      for (pVVar10 = langtag_00->variants; pVVar10 != (VariantListEntry *)0x0;
          pVVar10 = pVVar10->next) {
        iVar18 = iVar18 + -1;
        if (iVar18 == 0) {
          pcVar8 = pVVar10->variant;
          goto LAB_002b4a01;
        }
      }
      pcVar8 = (char *)0x0;
LAB_002b4a01:
      if ((int)uVar28 < localeIDCapacity) {
        localeID[uVar28] = '_';
      }
      uVar27 = (int)uVar28 + 1;
      cVar3 = *pcVar8;
      if (cVar3 != '\0') {
        lVar21 = 0;
        do {
          if ((int)(uVar27 + (int)lVar21) < localeIDCapacity) {
            cVar3 = uprv_toupper_63(cVar3);
            localeID[lVar21 + (ulong)uVar27] = cVar3;
          }
          cVar3 = pcVar8[lVar21 + 1];
          lVar21 = lVar21 + 1;
        } while (cVar3 != '\0');
        uVar27 = uVar27 + (int)lVar21;
      }
      uVar28 = (ulong)uVar27;
      iVar23 = iVar23 + 1;
      iVar31 = iVar31 + 1;
      status = local_168;
    } while (iVar17 != iVar23);
  }
  if (langtag_00->extensions == (ExtensionListEntry *)0x0) {
    if (*langtag_00->privateuse == '\0') goto LAB_002b4ac6;
  }
  else if ((int)uVar28 == 0) {
    if (0 < localeIDCapacity) {
      iVar5 = uprv_min_63(3,localeIDCapacity);
      memcpy(localeID,"und",(long)iVar5);
    }
    uVar28 = 3;
  }
  local_180 = (ExtensionListEntry *)0x0;
  iVar5 = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar17 = localeIDCapacity - (int)uVar28;
    pcVar8 = (char *)uprv_malloc_63((long)iVar17);
    if (pcVar8 == (char *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      pcVar13 = localeID + uVar28;
      local_1a8._0_1_ = langtag_00->variants != (VariantListEntry *)0x0;
      pEVar14 = langtag_00->extensions;
      local_150 = uVar28;
      if (pEVar14 != (ExtensionListEntry *)0x0) {
        iVar23 = -1;
        do {
          pEVar14 = pEVar14->next;
          iVar23 = iVar23 + 1;
        } while (pEVar14 != (ExtensionListEntry *)0x0);
        iVar18 = 1;
        iVar31 = 0;
        do {
          pEVar14 = langtag_00->extensions;
          pEVar19 = pEVar14;
          iVar24 = iVar18;
          if (pEVar14 == (ExtensionListEntry *)0x0) {
            pcVar26 = (char *)0x0;
          }
          else {
            do {
              iVar6 = iVar18;
              if (iVar24 + -1 == 0) {
                pcVar26 = pEVar19->key;
                goto LAB_002b4b8c;
              }
              ppEVar29 = &pEVar19->next;
              pEVar19 = *ppEVar29;
              iVar24 = iVar24 + -1;
            } while (*ppEVar29 != (ExtensionListEntry *)0x0);
            pcVar26 = (char *)0x0;
LAB_002b4b8c:
            do {
              if (iVar6 + -1 == 0) {
                s = (VariantListEntry **)pEVar14->value;
                goto LAB_002b4ba1;
              }
              pEVar14 = pEVar14->next;
              iVar6 = iVar6 + -1;
            } while (pEVar14 != (ExtensionListEntry *)0x0);
          }
          s = (VariantListEntry **)0x0;
LAB_002b4ba1:
          if (*pcVar26 == 'u') {
            uVar28 = 0;
            local_138 = (ExtensionListEntry *)0x0;
            local_140 = (AttributeListEntry *)0x0;
            cVar3 = *(char *)s;
            if (cVar3 == '\0') {
LAB_002b521b:
              bVar33 = SUB81(uVar28,0);
              pEVar14 = local_138;
              while (pEVar14 != (ExtensionListEntry *)0x0) {
                pEVar19 = pEVar14->next;
                _addExtensionToList(&local_180,pEVar14,'\0');
                pEVar14 = pEVar19;
              }
            }
            else {
              do {
                iVar24 = (int)uVar28;
                sVar7 = 0;
                while ((cVar3 != '\0' && (cVar3 != '-'))) {
                  lVar21 = sVar7 + 1;
                  sVar7 = sVar7 + 1;
                  cVar3 = *(char *)((long)s + lVar21);
                }
                iVar6 = (int)sVar7;
                UVar4 = ultag_isUnicodeLocaleKey_63((char *)s,iVar6);
                if (UVar4 != '\0') goto LAB_002b4c88;
                pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x10);
                if (pEVar14 == (ExtensionListEntry *)0x0) goto LAB_002b5240;
                if (100 - iVar24 <= iVar6) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                  goto LAB_002b4cfa;
                }
                memcpy(acStack_98 + uVar28,s,sVar7);
                acStack_98[(uint)(iVar6 + iVar24)] = '\0';
                pEVar14->key = acStack_98 + uVar28;
                UVar4 = _addAttributeToList(&local_140,(AttributeListEntry *)pEVar14);
                if (UVar4 == '\0') {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                  uprv_free_63(pEVar14);
                  goto LAB_002b524b;
                }
                s = (VariantListEntry **)
                    ((long)s + ((sVar7 + 1) - (ulong)(*(char *)((long)s + sVar7) == '\0')));
                uVar28 = (ulong)(iVar6 + iVar24 + 1);
                cVar3 = *(char *)s;
              } while (cVar3 != '\0');
              iVar24 = iVar24 + iVar6 + 1;
              s = (VariantListEntry **)0x0;
LAB_002b4c88:
              pAVar32 = local_140;
              if (local_140 == (AttributeListEntry *)0x0) {
                local_158 = 0;
LAB_002b4e2d:
                local_1b0 = (char *)0x0;
                uVar28 = 0;
                if (s == (VariantListEntry **)0x0) goto LAB_002b521b;
                local_190 = (VariantListEntry **)0x0;
                local_160 = (VariantListEntry **)0x0;
                local_1a0 = 0;
                uVar20 = 0;
                do {
                  if ((char)uVar20 != '\0') goto LAB_002b521b;
                  cVar3 = *(char *)s;
                  iVar24 = (int)local_1a0;
                  if (cVar3 == '\0') {
                    uVar20 = CONCAT71((int7)(uVar20 >> 8),1);
                    uVar30 = 0;
                    ppVVar22 = (VariantListEntry **)0x0;
LAB_002b4ed8:
                    iVar6 = (int)local_1b0;
                    if (iVar6 < 9) {
                      local_178 = (char **)CONCAT44(local_178._4_4_,(int)uVar20);
                      pcVar26 = (char *)(long)iVar6;
                      local_148 = ppVVar22;
                      strncpy(local_129,(char *)local_190,(size_t)pcVar26);
                      local_129[(long)pcVar26] = '\0';
                      local_170 = pcVar26;
                      pcVar26 = uloc_toLegacyKey_63(local_129);
                      if (pcVar26 == (char *)0x0) {
                        *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b51f8:
                        iVar24 = 7;
LAB_002b51fd:
                        uVar20 = (ulong)local_178 & 0xffffffff;
                        goto LAB_002b5209;
                      }
                      if (pcVar26 == local_129) {
                        T_CString_toLowerCase_63(local_129);
                        uVar27 = (uint)local_158;
                        if ((int)(~uVar27 + iVar17) < iVar6) {
                          *status = U_BUFFER_OVERFLOW_ERROR;
                          goto LAB_002b51f8;
                        }
                        pcVar26 = pcVar8 + (int)uVar27;
                        memcpy(pcVar26,local_129,(size_t)local_170);
                        pcVar8[(int)(iVar6 + uVar27)] = '\0';
                        local_158 = (ulong)(uVar27 + iVar6 + 1);
                      }
                      if (local_160 == (VariantListEntry **)0x0) {
                        pcVar16 = "yes";
                        goto LAB_002b513d;
                      }
                      UVar25 = U_ILLEGAL_ARGUMENT_ERROR;
                      if (iVar24 < 0x80) {
                        sVar7 = (size_t)iVar24;
                        strncpy(local_118,(char *)local_160,sVar7);
                        local_118[sVar7] = '\0';
                        local_170 = pcVar26;
                        local_120 = sVar7;
                        pcVar16 = uloc_toLegacyType_63(pcVar26,local_118);
                        UVar25 = U_ILLEGAL_ARGUMENT_ERROR;
                        uVar20 = (ulong)local_178 & 0xffffffff;
                        if (pcVar16 != (char *)0x0) {
                          pcVar26 = local_170;
                          status = local_168;
                          if (pcVar16 == local_118) {
                            T_CString_toLowerCase_63(local_118);
                            uVar20 = (ulong)local_178 & 0xffffffff;
                            uVar27 = (uint)local_158;
                            UVar25 = U_BUFFER_OVERFLOW_ERROR;
                            if ((int)(~uVar27 + iVar17) < iVar24) goto LAB_002b50d1;
                            pcVar16 = pcVar8 + (int)uVar27;
                            memcpy(pcVar16,local_118,local_120);
                            pcVar8[(int)(uVar27 + iVar24)] = '\0';
                            local_158 = (ulong)(uVar27 + iVar24 + 1);
                            pcVar26 = local_170;
                            status = local_168;
                          }
LAB_002b513d:
                          local_170 = pcVar16;
                          if ((((local_1a8._0_1_ == false) && (*pcVar26 == 'v')) &&
                              (pcVar26[1] == 'a')) &&
                             ((pcVar26[2] == '\0' && (iVar24 = strcmp(pcVar16,"posix"), iVar24 == 0)
                              ))) {
                            uVar28 = 1;
                          }
                          else {
                            pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x18);
                            if (pEVar14 == (ExtensionListEntry *)0x0) {
                              *status = U_MEMORY_ALLOCATION_ERROR;
                              goto LAB_002b51f8;
                            }
                            pEVar14->key = pcVar26;
                            pEVar14->value = local_170;
                            UVar4 = _addExtensionToList(&local_138,pEVar14,'\0');
                            if (UVar4 == '\0') {
                              uprv_free_63(pEVar14);
                            }
                          }
                          local_160 = (VariantListEntry **)0x0;
                          local_1b0 = (char *)(uVar30 & 0xffffffff);
                          if (local_148 == (VariantListEntry **)0x0) {
                            local_1b0 = (char *)0x0;
                          }
                          local_190 = local_148;
                          local_1a0 = 0;
                          iVar24 = 0;
                          goto LAB_002b51fd;
                        }
                      }
                      else {
                        uVar20 = (ulong)local_178 & 0xffffffff;
                      }
LAB_002b50d1:
                      *local_168 = UVar25;
                      status = local_168;
                    }
                    else {
                      *status = U_ILLEGAL_ARGUMENT_ERROR;
                    }
                    iVar24 = 7;
                  }
                  else {
                    uVar30 = 0;
                    while ((cVar3 != '\0' && (cVar3 != '-'))) {
                      lVar21 = uVar30 + 1;
                      uVar30 = uVar30 + 1;
                      cVar3 = *(char *)((long)s + lVar21);
                    }
                    UVar4 = ultag_isUnicodeLocaleKey_63((char *)s,(int)uVar30);
                    if (UVar4 == '\0') {
                      if (local_160 == (VariantListEntry **)0x0) {
                        local_1a0 = uVar30 & 0xffffffff;
                        local_160 = s;
                      }
                      else {
                        local_1a0 = (ulong)(iVar24 + (int)uVar30 + 1);
                      }
                    }
                    else {
                      if (local_190 != (VariantListEntry **)0x0) {
                        uVar20 = 0;
                        ppVVar22 = s;
                        s = (VariantListEntry **)
                            ((long)s + ((uVar30 + 1) - (ulong)(*(char *)((long)s + uVar30) == '\0'))
                            );
                        goto LAB_002b4ed8;
                      }
                      local_1b0 = (char *)(uVar30 & 0xffffffff);
                      local_190 = s;
                    }
                    s = (VariantListEntry **)
                        ((long)s + ((uVar30 + 1) - (ulong)(*(char *)((long)s + uVar30) == '\0')));
                    uVar20 = 0;
                    iVar24 = 0;
                  }
LAB_002b5209:
                  bVar33 = SUB81(uVar28,0);
                } while (iVar24 == 0);
                pAVar32 = local_140;
                if (iVar24 == 7) goto joined_r0x002b525a;
              }
              else {
                if (iVar17 < iVar24) {
                  *status = U_ILLEGAL_ARGUMENT_ERROR;
                }
                else {
                  pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x18);
                  if (pEVar14 == (ExtensionListEntry *)0x0) {
LAB_002b5240:
                    *status = U_MEMORY_ALLOCATION_ERROR;
                  }
                  else {
                    pEVar14->key = "attribute";
                    pEVar14->value = pcVar8;
                    iVar24 = 0;
                    pAVar15 = pAVar32;
                    do {
                      pAVar1 = pAVar15->next;
                      if (pAVar15 != pAVar32) {
                        pcVar8[iVar24] = '-';
                        iVar24 = iVar24 + 1;
                      }
                      pcVar26 = pAVar15->attribute;
                      sVar7 = strlen(pcVar26);
                      memcpy(pcVar8 + iVar24,pcVar26,(long)(int)sVar7);
                      status = local_168;
                      iVar24 = (int)sVar7 + iVar24;
                      pAVar15 = pAVar1;
                    } while (pAVar1 != (AttributeListEntry *)0x0);
                    pcVar8[iVar24] = '\0';
                    UVar4 = _addExtensionToList(&local_138,pEVar14,'\0');
                    if (UVar4 != '\0') {
                      local_158 = (ulong)(iVar24 + 1);
                      do {
                        pAVar15 = pAVar32->next;
                        uprv_free_63(pAVar32);
                        pAVar32 = pAVar15;
                      } while (pAVar15 != (AttributeListEntry *)0x0);
                      local_140 = (AttributeListEntry *)0x0;
                      status = local_168;
                      goto LAB_002b4e2d;
                    }
                    *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002b4cfa:
                    uprv_free_63(pEVar14);
                  }
                }
LAB_002b524b:
                bVar33 = false;
                pAVar32 = local_140;
joined_r0x002b525a:
                while (pEVar14 = local_138, pAVar32 != (AttributeListEntry *)0x0) {
                  pAVar15 = pAVar32->next;
                  uprv_free_63(pAVar32);
                  pAVar32 = pAVar15;
                }
                while (pEVar14 != (ExtensionListEntry *)0x0) {
                  pEVar19 = pEVar14->next;
                  uprv_free_63(pEVar14);
                  pEVar14 = pEVar19;
                }
              }
            }
            local_1a8._0_1_ = bVar33;
            if (U_ZERO_ERROR < *status) goto LAB_002b549e;
          }
          else {
            pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x18);
            if (pEVar14 == (ExtensionListEntry *)0x0) goto LAB_002b5486;
            pEVar14->key = pcVar26;
            pEVar14->value = (char *)s;
            UVar4 = _addExtensionToList(&local_180,pEVar14,'\0');
            if (UVar4 == '\0') goto LAB_002b548d;
          }
          iVar18 = iVar18 + 1;
          bVar33 = iVar23 != iVar31;
          iVar31 = iVar31 + 1;
        } while (bVar33);
        local_1a8._0_1_ = local_1a8._0_1_ != false;
      }
      UVar25 = *status;
      if (UVar25 < U_ILLEGAL_ARGUMENT_ERROR) {
        pcVar26 = langtag_00->privateuse;
        sVar7 = strlen(pcVar26);
        if (0 < (int)sVar7) {
          pEVar14 = (ExtensionListEntry *)uprv_malloc_63(0x18);
          if (pEVar14 == (ExtensionListEntry *)0x0) {
LAB_002b5486:
            UVar25 = U_MEMORY_ALLOCATION_ERROR;
          }
          else {
            pEVar14->key = "x";
            pEVar14->value = pcVar26;
            UVar4 = _addExtensionToList(&local_180,pEVar14,'\0');
            if (UVar4 != '\0') {
              UVar25 = *status;
              goto LAB_002b5346;
            }
LAB_002b548d:
            uprv_free_63(pEVar14);
            UVar25 = U_ILLEGAL_ARGUMENT_ERROR;
          }
          *status = UVar25;
          goto LAB_002b549e;
        }
LAB_002b5346:
        length = 0;
        if (((bool)(UVar25 < U_ILLEGAL_ARGUMENT_ERROR & local_1a8._0_1_)) &&
           (length = 6, 0 < iVar17)) {
          iVar5 = uprv_min_63(6,iVar17);
          memcpy(pcVar13,"_POSIX",(long)iVar5);
          UVar25 = *status;
        }
        pEVar14 = local_180;
        if (local_180 != (ExtensionListEntry *)0x0 && UVar25 < U_ILLEGAL_ARGUMENT_ERROR) {
          cVar3 = '\x01';
          pEVar19 = local_180;
          do {
            if (length < iVar17) {
              pcVar13[length] = cVar3 * '\x05' + ';';
              cVar3 = '\0';
            }
            iVar23 = length + 1;
            pcVar26 = pEVar19->key;
            sVar7 = strlen(pcVar26);
            if (iVar17 - iVar23 != 0 && iVar23 <= iVar17) {
              iVar5 = uprv_min_63((int32_t)sVar7,iVar17 - iVar23);
              memcpy(pcVar13 + iVar23,pcVar26,(long)iVar5);
            }
            iVar23 = iVar23 + (int32_t)sVar7;
            if (iVar23 < iVar17) {
              pcVar13[iVar23] = '=';
            }
            iVar23 = iVar23 + 1;
            pcVar26 = pEVar19->value;
            sVar7 = strlen(pcVar26);
            if (iVar17 - iVar23 != 0 && iVar23 <= iVar17) {
              iVar5 = uprv_min_63((int32_t)sVar7,iVar17 - iVar23);
              memcpy(pcVar13 + iVar23,pcVar26,(long)iVar5);
            }
            length = iVar23 + (int32_t)sVar7;
            pEVar19 = pEVar19->next;
          } while (pEVar19 != (ExtensionListEntry *)0x0);
        }
      }
      else {
LAB_002b549e:
        length = 0;
        pEVar14 = local_180;
      }
      iVar5 = 0;
      while (pEVar14 != (ExtensionListEntry *)0x0) {
        pEVar19 = pEVar14->next;
        uprv_free_63(pEVar14);
        pEVar14 = pEVar19;
      }
      uprv_free_63(pcVar8);
      uVar28 = local_150;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        iVar5 = u_terminateChars_63(pcVar13,iVar17,length,status);
        uVar28 = local_150;
      }
    }
  }
  uVar28 = (ulong)(uint)(iVar5 + (int)uVar28);
LAB_002b4ac6:
  ultag_close(langtag_00);
  iVar5 = u_terminateChars_63(localeID,localeIDCapacity,(int32_t)uVar28,status);
  return iVar5;
LAB_002b4728:
  *status = U_MEMORY_ALLOCATION_ERROR;
  ultag_close(langtag_00);
  langtag_00 = (ULanguageTag *)0x0;
  goto LAB_002b4837;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ulocimp_forLanguageTag(const char* langtag,
                       int32_t tagLen,
                       char* localeID,
                       int32_t localeIDCapacity,
                       int32_t* parsedLength,
                       UErrorCode* status) {
    ULanguageTag *lt;
    int32_t reslen = 0;
    const char *subtag, *p;
    int32_t len;
    int32_t i, n;
    UBool noRegion = TRUE;

    lt = ultag_parse(langtag, tagLen, parsedLength, status);
    if (U_FAILURE(*status)) {
        return 0;
    }

    /* language */
    subtag = ultag_getExtlangSize(lt) > 0 ? ultag_getExtlang(lt, 0) : ultag_getLanguage(lt);
    if (uprv_compareInvCharsAsAscii(subtag, LANG_UND) != 0) {
        len = (int32_t)uprv_strlen(subtag);
        if (len > 0) {
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID, subtag, uprv_min(len, localeIDCapacity - reslen));
            }
            reslen += len;
        }
    }

    /* script */
    subtag = ultag_getScript(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;

        /* write out the script in title case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                if (p == subtag) {
                    *(localeID + reslen) = uprv_toupper(*p);
                } else {
                    *(localeID + reslen) = *p;
                }
            }
            reslen++;
            p++;
        }
    }

    /* region */
    subtag = ultag_getRegion(lt);
    len = (int32_t)uprv_strlen(subtag);
    if (len > 0) {
        if (reslen < localeIDCapacity) {
            *(localeID + reslen) = LOCALE_SEP;
        }
        reslen++;
        /* write out the retion in upper case */
        p = subtag;
        while (*p) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = uprv_toupper(*p);
            }
            reslen++;
            p++;
        }
        noRegion = FALSE;
    }

    /* variants */
    n = ultag_getVariantsSize(lt);
    if (n > 0) {
        if (noRegion) {
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
        }

        for (i = 0; i < n; i++) {
            subtag = ultag_getVariant(lt, i);
            if (reslen < localeIDCapacity) {
                *(localeID + reslen) = LOCALE_SEP;
            }
            reslen++;
            /* write out the variant in upper case */
            p = subtag;
            while (*p) {
                if (reslen < localeIDCapacity) {
                    *(localeID + reslen) = uprv_toupper(*p);
                }
                reslen++;
                p++;
            }
        }
    }

    /* keywords */
    n = ultag_getExtensionsSize(lt);
    subtag = ultag_getPrivateUse(lt);
    if (n > 0 || uprv_strlen(subtag) > 0) {
        if (reslen == 0 && n > 0) {
            /* need a language */
            if (reslen < localeIDCapacity) {
                uprv_memcpy(localeID + reslen, LANG_UND, uprv_min(LANG_UND_LEN, localeIDCapacity - reslen));
            }
            reslen += LANG_UND_LEN;
        }
        len = _appendKeywords(lt, localeID + reslen, localeIDCapacity - reslen, status);
        reslen += len;
    }

    ultag_close(lt);
    return u_terminateChars(localeID, localeIDCapacity, reslen, status);
}